

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
MetadataTest_RemoveMetadataFromImage_Test::TestBody(MetadataTest_RemoveMetadataFromImage_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  aom_image_t image;
  int *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  Type in_stack_ffffffffffffff2c;
  AssertHelper *in_stack_ffffffffffffff30;
  AssertionResult local_c0 [3];
  Message *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  
  aom_img_add_metadata
            ((aom_image_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff24,
             (uint8_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (aom_metadata_insert_flags_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  this_01 = local_c0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(int *)this_01,
             in_stack_ffffffffffffff00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbad7e7)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c,(char *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xbad835);
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbad885);
  if (uVar3 == 0) {
    aom_img_remove_metadata((aom_image_t *)0xbad89b);
    aom_img_remove_metadata((aom_image_t *)0xbad8a4);
  }
  return;
}

Assistant:

TEST(MetadataTest, RemoveMetadataFromImage) {
  aom_image_t image;
  image.metadata = nullptr;

  ASSERT_EQ(aom_img_add_metadata(&image, OBU_METADATA_TYPE_ITUT_T35,
                                 kMetadataPayloadT35, kMetadataPayloadSizeT35,
                                 AOM_MIF_ANY_FRAME),
            0);
  aom_img_remove_metadata(&image);
  aom_img_remove_metadata(nullptr);
}